

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_env_cell_loc1(sexp env,sexp key,int localp,sexp_conflict *varenv)

{
  anon_union_24768_35_b8e82fc1_for_value *paVar1;
  sexp psVar2;
  
  do {
    paVar1 = &env->value;
    while ((paVar1 = *(anon_union_24768_35_b8e82fc1_for_value **)(paVar1->flonum_bits + 0x18),
           psVar2 = env, ((ulong)paVar1 & 3) == 0 && (*(int *)paVar1 == 6))) {
      if (*(sexp *)((long)paVar1 + 8) == key) {
        if (varenv != (sexp_conflict *)0x0) {
          *varenv = env;
        }
        return *(sexp *)(paVar1->flonum_bits + 0x10);
      }
    }
    while ((psVar2 = (psVar2->value).type.slots, ((ulong)psVar2 & 3) == 0 && (psVar2->tag == 6))) {
      if ((psVar2->value).type.name == key) {
        if (varenv != (sexp_conflict *)0x0) {
          *varenv = env;
        }
        return psVar2;
      }
    }
  } while ((((localp == 0) && (env = (env->value).type.name, env != (sexp)0x0)) &&
           (((ulong)env & 3) == 0)) && (env->tag == 0x17));
  return (sexp)0x0;
}

Assistant:

static sexp sexp_env_cell_loc1 (sexp env, sexp key, int localp, sexp *varenv) {
  sexp ls;
  do {
#if SEXP_USE_RENAME_BINDINGS
    for (ls=sexp_env_renames(env); sexp_pairp(ls); ls=sexp_env_next_cell(ls))
      if (sexp_car(ls) == key) {
        if (varenv) *varenv = env;
        return sexp_cdr(ls);
      }
#endif
    for (ls=sexp_env_bindings(env); sexp_pairp(ls); ls=sexp_env_next_cell(ls))
      if (sexp_car(ls) == key) {
        if (varenv) *varenv = env;
        return ls;
      }
    if (localp) break;
    env = sexp_env_parent(env);
  } while (env && sexp_envp(env));
  return NULL;
}